

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::SPxBasisBase<double>::change
          (SPxBasisBase<double> *this,int i,SPxId *id,SVectorBase<double> *enterVec,
          SSVectorBase<double> *eta)

{
  SVectorBase<double> **ppSVar1;
  SPxId *pSVar2;
  int iVar3;
  SPxOut *pSVar4;
  double extraout_XMM0_Qa;
  double t;
  double t_00;
  Verbosity old_verbosity;
  undefined4 local_2c;
  double local_28;
  
  this->lastidx = i;
  (this->lastin).super_DataKey = id->super_DataKey;
  if ((i < 0) || ((id->super_DataKey).info == 0)) {
    (this->lastout).super_DataKey = id->super_DataKey;
    return;
  }
  ppSVar1 = (this->matrix).data;
  this->nzCount = (this->nzCount - ppSVar1[(uint)i]->memused) + enterVec->memused;
  ppSVar1[(uint)i] = enterVec;
  pSVar2 = (this->theBaseId).data;
  (this->lastout).super_DataKey = pSVar2[(uint)i].super_DataKey;
  pSVar2[(uint)i].super_DataKey = id->super_DataKey;
  this->iterCount = this->iterCount + 1;
  this->updateCount = this->updateCount + 1;
  (*this->factor->_vptr_SLinSolver[3])();
  (*this->theLP->theTime->_vptr_Timer[6])();
  if (this->factorized == false) {
    (*this->_vptr_SPxBasisBase[0xb])(this);
    return;
  }
  iVar3 = (*this->factor->_vptr_SLinSolver[3])();
  local_28 = (double)iVar3;
  iVar3 = (*this->factor->_vptr_SLinSolver[4])();
  if (local_28 <= (double)this->lastMem * this->memFactor + (double)(iVar3 + 1000)) {
    iVar3 = (*this->factor->_vptr_SLinSolver[3])();
    if ((double)this->nzCount * this->lastFill < (double)iVar3) {
      pSVar4 = this->spxout;
      if ((pSVar4 == (SPxOut *)0x0) || ((int)pSVar4->m_verbosity < 5)) goto LAB_001c4619;
      local_2c = 5;
      old_verbosity = pSVar4->m_verbosity;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = soplex::operator<<(this->spxout,"IBASIS04 fill factor triggers refactorization");
      pSVar4 = soplex::operator<<(pSVar4," memory= ");
      iVar3 = (*this->factor->_vptr_SLinSolver[3])();
      pSVar4 = soplex::operator<<(pSVar4,iVar3);
      pSVar4 = soplex::operator<<(pSVar4," nzCount= ");
      pSVar4 = soplex::operator<<(pSVar4,this->nzCount);
      pSVar4 = soplex::operator<<(pSVar4," lastFill= ");
      t_00 = this->lastFill;
      goto LAB_001c45f1;
    }
    if (this->lastNzCount < this->nzCount) {
      pSVar4 = this->spxout;
      if ((pSVar4 == (SPxOut *)0x0) || ((int)pSVar4->m_verbosity < 5)) goto LAB_001c4619;
      local_2c = 5;
      old_verbosity = pSVar4->m_verbosity;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = soplex::operator<<(this->spxout,"IBASIS05 nonzero factor triggers refactorization");
      pSVar4 = soplex::operator<<(pSVar4," nzCount= ");
      pSVar4 = soplex::operator<<(pSVar4,this->nzCount);
      pSVar4 = soplex::operator<<(pSVar4," lastNzCount= ");
      pSVar4 = soplex::operator<<(pSVar4,this->lastNzCount);
      pSVar4 = soplex::operator<<(pSVar4," nonzeroFactor= ");
      t_00 = this->nonzeroFactor;
      goto LAB_001c45f1;
    }
    if (this->updateCount < this->maxUpdates) {
      (*this->factor->_vptr_SLinSolver[9])(this->factor,(ulong)(uint)i,enterVec,eta);
      this->totalUpdateCount = this->totalUpdateCount + 1;
      iVar3 = (*this->factor->_vptr_SLinSolver[1])();
      if ((iVar3 == 0) &&
         ((*this->factor->_vptr_SLinSolver[6])(), this->minStab <= extraout_XMM0_Qa)) {
        return;
      }
      pSVar4 = this->spxout;
      if ((pSVar4 == (SPxOut *)0x0) || ((int)pSVar4->m_verbosity < 5)) goto LAB_001c4619;
      local_2c = 5;
      old_verbosity = pSVar4->m_verbosity;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = soplex::operator<<(this->spxout,"IBASIS07 stability triggers refactorization");
      pSVar4 = soplex::operator<<(pSVar4," stability= ");
      (*this->factor->_vptr_SLinSolver[6])();
      pSVar4 = soplex::operator<<(pSVar4,t);
      pSVar4 = soplex::operator<<(pSVar4," minStab= ");
      t_00 = this->minStab;
      goto LAB_001c45f1;
    }
    pSVar4 = this->spxout;
    if ((pSVar4 == (SPxOut *)0x0) || ((int)pSVar4->m_verbosity < 5)) goto LAB_001c4619;
    local_2c = 5;
    old_verbosity = pSVar4->m_verbosity;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = soplex::operator<<(this->spxout,"IBASIS06 update count triggers refactorization");
    pSVar4 = soplex::operator<<(pSVar4," updateCount= ");
    pSVar4 = soplex::operator<<(pSVar4,this->updateCount);
    pSVar4 = soplex::operator<<(pSVar4," maxUpdates= ");
    pSVar4 = soplex::operator<<(pSVar4,this->maxUpdates);
  }
  else {
    pSVar4 = this->spxout;
    if ((pSVar4 == (SPxOut *)0x0) || ((int)pSVar4->m_verbosity < 5)) goto LAB_001c4619;
    local_2c = 5;
    old_verbosity = pSVar4->m_verbosity;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = soplex::operator<<(this->spxout,
                                "IBASIS04 memory growth factor triggers refactorization");
    pSVar4 = soplex::operator<<(pSVar4," memory= ");
    iVar3 = (*this->factor->_vptr_SLinSolver[3])();
    pSVar4 = soplex::operator<<(pSVar4,iVar3);
    pSVar4 = soplex::operator<<(pSVar4," lastMem= ");
    pSVar4 = soplex::operator<<(pSVar4,this->lastMem);
    pSVar4 = soplex::operator<<(pSVar4," memFactor= ");
    t_00 = this->memFactor;
LAB_001c45f1:
    pSVar4 = soplex::operator<<(pSVar4,t_00);
  }
  std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
  (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
LAB_001c4619:
  (*this->_vptr_SPxBasisBase[0xb])(this);
  return;
}

Assistant:

void SPxBasisBase<R>::change(
   int i,
   SPxId& id,
   const SVectorBase<R>* enterVec,
   const SSVectorBase<R>* eta)
{

   assert(matrixIsSetup);
   assert(!id.isValid() || (enterVec != nullptr));
   assert(factor != nullptr);

   lastidx = i;
   lastin  = id;

   if(id.isValid() && i >= 0)
   {
      assert(enterVec != nullptr);

      // update the counter for nonzeros in the basis matrix
      nzCount      = nzCount - matrix[i]->size() + enterVec->size();
      // let the new id enter the basis
      matrix[i]    = enterVec;
      lastout      = theBaseId[i];
      theBaseId[i] = id;

      ++iterCount;
      ++updateCount;

      SPxOut::debug(this,
                    "factor_stats: iteration= {}, update= {}, total_update= {}, nonzero_B= {}, nonzero_LU= {}, factor_fill= {}, time= {}\n",
                    this->iteration(), updateCount, totalUpdateCount, nzCount, factor->memory(), lastFill,
                    theLP->time());

      // never factorize? Just do it !
      if(!factorized)
         factorize();

      // too much memory growth ?
      else if(R(factor->memory()) > 1000 + factor->dim() + lastMem * memFactor)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                       "IBASIS04 memory growth factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " lastMem= " << lastMem
                       << " memFactor= " << memFactor
                       << std::endl;)
         factorize();
      }

      // relative fill too high ?
      else if(R(factor->memory()) > lastFill * R(nzCount))
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS04 fill factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " nzCount= " << nzCount
                       << " lastFill= " << lastFill
                       << std::endl;)

         factorize();
      }
      // absolute fill in basis matrix too high ?
      else if(nzCount > lastNzCount)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS05 nonzero factor triggers refactorization"
                       << " nzCount= " << nzCount
                       << " lastNzCount= " << lastNzCount
                       << " nonzeroFactor= " << nonzeroFactor
                       << std::endl;)
         factorize();
      }
      // too many updates ?
      else if(updateCount >= maxUpdates)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS06 update count triggers refactorization"
                       << " updateCount= " << updateCount
                       << " maxUpdates= " << maxUpdates
                       << std::endl;)
         factorize();
      }
      else
      {
         try
         {
#ifdef MEASUREUPDATETIME
            theTime.start();
#endif
            factor->change(i, *enterVec, eta);
            totalUpdateCount++;
#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif
         }
         catch(...)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                          "IBASIS13 problems updating factorization; refactorizing basis"
                          << std::endl;)

#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif

            // singularity was detected in update; we refactorize
            factorize();

            // if factorize() detects singularity, an exception is thrown, hence at this point we have a regular basis
            // and can try the update again
            assert(status() >= SPxBasisBase<R>::REGULAR);

            try
            {
#ifdef MEASUREUPDATETIME
               theTime.start();
#endif
               factor->change(i, *enterVec, eta);
               totalUpdateCount++;
#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif
            }
            // with a freshly factorized, regular basis, the update is unlikely to fail; if this happens nevertheless,
            // we have to invalidate the basis to have the statuses correct
            catch(const SPxException& F)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                             "IBASIS14 problems updating factorization; invalidating factorization"
                             << std::endl;)

#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif

               factorized = false;
               throw F;
            }
         }

         assert(minStab > 0.0);

         if(factor->status() != SLinSolver<R>::OK || factor->stability() < minStab)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS07 stability triggers refactorization"
                          << " stability= " << factor->stability()
                          << " minStab= " << minStab
                          << std::endl;)
            factorize();
         }
      }
   }
   else
      lastout = id;
}